

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::RetentionTest_TopLevelExtension_Test::
~RetentionTest_TopLevelExtension_Test(RetentionTest_TopLevelExtension_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RetentionTest, TopLevelExtension) {
  CheckOptionsMessageIsStrippedCorrectly(
      proto2_unittest::TopLevelMessage::descriptor()
          ->file()
          ->FindExtensionByName("i")
          ->options()
          .GetExtension(proto2_unittest::field_option));
}